

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
ctemplate::BaseArena::GetMemoryFallback(BaseArena *this,size_t size,int align_as_int)

{
  ulong uVar1;
  AllocatedBlock *pAVar2;
  ulong uVar3;
  size_t waste;
  size_t overage;
  size_t align;
  int align_as_int_local;
  size_t size_local;
  BaseArena *this_local;
  
  if (size == 0) {
    this_local = (BaseArena *)0x0;
  }
  else {
    uVar1 = (ulong)align_as_int;
    if (align_as_int < 1 || (uVar1 & uVar1 - 1) != 0) {
      __assert_fail("align_as_int > 0 && 0 == (align & (align - 1))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                    ,0x110,"void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)")
      ;
    }
    if ((this->block_size_ == 0) || (this->block_size_ >> 2 < size)) {
      if (8 < uVar1) {
        __assert_fail("align <= kDefaultAlignment",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x116,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      pAVar2 = AllocNewBlock(this,size);
      this_local = (BaseArena *)pAVar2->mem;
    }
    else {
      uVar3 = (ulong)this->freestart_ & uVar1 - 1;
      if (uVar3 != 0) {
        uVar3 = uVar1 - uVar3;
        this->freestart_ = this->freestart_ + uVar3;
        if (uVar3 < this->remaining_) {
          this->remaining_ = this->remaining_ - uVar3;
        }
        else {
          this->remaining_ = 0;
        }
      }
      if (this->remaining_ < size) {
        MakeNewBlock(this);
      }
      this->remaining_ = this->remaining_ - size;
      this->last_alloc_ = this->freestart_;
      this->freestart_ = this->freestart_ + size;
      if (((ulong)this->last_alloc_ & uVar1 - 1) != 0) {
        __assert_fail("0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/base/arena.cc"
                      ,0x12d,
                      "void *ctemplate::BaseArena::GetMemoryFallback(const size_t, const int)");
      }
      this_local = (BaseArena *)this->last_alloc_;
    }
  }
  return this_local;
}

Assistant:

void* BaseArena::GetMemoryFallback(const size_t size, const int align_as_int) {
  if (0 == size) {
    return NULL;             // stl/stl_alloc.h says this is okay
  }
  // This makes the type-checker happy.
  const size_t align = static_cast<size_t>(align_as_int);

  assert(align_as_int > 0 && 0 == (align & (align - 1))); // must be power of 2

  // If the object is more than a quarter of the block size, allocate
  // it separately to avoid wasting too much space in leftover bytes
  if (block_size_ == 0 || size > block_size_/4) {
    // then it gets its own block in the arena
    assert(align <= kDefaultAlignment);   // because that's what new gives us
    // This block stays separate from the rest of the world; in particular
    // we don't update last_alloc_ so you can't reclaim space on this block.
    return AllocNewBlock(size)->mem;
  }

  const size_t overage =
    (reinterpret_cast<uintptr_t>(freestart_) & (align-1));
  if (overage) {
    const size_t waste = align - overage;
    freestart_ += waste;
    if (waste < remaining_) {
      remaining_ -= waste;
    } else {
      remaining_ = 0;
    }
  }
  if (size > remaining_) {
    MakeNewBlock();
  }
  remaining_ -= size;
  last_alloc_ = freestart_;
  freestart_ += size;
  assert(0 == (reinterpret_cast<uintptr_t>(last_alloc_) & (align-1)));
  return reinterpret_cast<void*>(last_alloc_);
}